

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aierror.cpp
# Opt level: O2

string * __thiscall
ai::formatErrno_abi_cxx11_(string *__return_storage_ptr__,ai *this,int error_code)

{
  string sStack_38;
  
  stringFromErrno_abi_cxx11_(&sStack_38,this,error_code);
  formatError(__return_storage_ptr__,(int)this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string formatErrno(const int error_code)
    {
        return ai::formatError(error_code, ai::stringFromErrno(error_code));
    }